

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

DeviceData * __thiscall
QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
          (QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *this,QPaintDevice **key)

{
  DeviceData *pDVar1;
  DeviceData *in_RDI;
  DeviceData *v;
  DeviceData *in_stack_ffffffffffffffc8;
  DeviceData *pDVar2;
  
  pDVar2 = in_RDI;
  pDVar1 = QHash<QPaintDevice*,QGraphicsItemCache::DeviceData>::valueImpl<QPaintDevice*>
                     ((QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *)in_RDI,
                      (QPaintDevice **)in_RDI);
  if (pDVar1 == (DeviceData *)0x0) {
    QGraphicsItemCache::DeviceData::DeviceData(in_RDI);
  }
  else {
    QGraphicsItemCache::DeviceData::DeviceData(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pDVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }